

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Bitmask whereOmitNoopJoin(WhereInfo *pWInfo,Bitmask notReady)

{
  byte bVar1;
  byte bVar2;
  WhereLoop *pWVar3;
  SrcList *pSVar4;
  ulong uVar5;
  ulong uVar6;
  Bitmask BVar7;
  Bitmask BVar8;
  WhereTerm *pWVar9;
  WhereTerm *pWVar10;
  WhereTerm *pWVar11;
  ulong uVar12;
  ulong uVar13;
  byte local_39;
  
  BVar7 = sqlite3WhereExprListUsage(&pWInfo->sMaskSet,pWInfo->pResultSet);
  if (pWInfo->pOrderBy != (ExprList *)0x0) {
    BVar8 = sqlite3WhereExprListUsage(&pWInfo->sMaskSet,pWInfo->pOrderBy);
    BVar7 = BVar7 | BVar8;
  }
  bVar1 = pWInfo->pTabList->a[0].fg.jointype;
  local_39 = pWInfo->nLevel;
  BVar8 = 0xffffffffffffffff;
  uVar13 = (ulong)local_39;
LAB_00187243:
  do {
    do {
      uVar12 = uVar13;
      if ((long)uVar12 < 2) {
        return BVar8;
      }
      uVar13 = uVar12 - 1;
      pWVar3 = pWInfo->a[uVar12 - 1].pWLoop;
      pSVar4 = pWInfo->pTabList;
      bVar2 = pWVar3->iTab;
    } while (((pSVar4->a[bVar2].fg.jointype & 0x18) != 8) ||
            ((((pWInfo->wctrlFlags & 0x100) == 0 && ((pWVar3->wsFlags & 0x1000) == 0)) ||
             (uVar5 = pWVar3->maskSelf, (uVar5 & BVar7) != 0))));
    pWVar9 = (pWInfo->sWC).a;
    pWVar10 = pWVar9 + (pWInfo->sWC).nTerm;
    for (pWVar11 = pWVar9; pWVar11 < pWVar10; pWVar11 = pWVar11 + 1) {
      if ((((pWVar11->prereqAll & uVar5) != 0) &&
          (((pWVar11->pExpr->flags & 1) == 0 ||
           ((pWVar11->pExpr->w).iJoin != pSVar4->a[bVar2].iCursor)))) ||
         (((bVar1 & 0x40) != 0 &&
          (((pWVar11->pExpr->flags & 2) != 0 &&
           ((pWVar11->pExpr->w).iJoin == pSVar4->a[bVar2].iCursor)))))) goto LAB_00187243;
    }
    uVar6 = pWInfo->revMask;
    pWInfo->revMask =
         ((uVar6 >> 1 ^ uVar6) >> ((byte)uVar13 & 0x3f)) << ((byte)uVar13 & 0x3f) ^ uVar6;
    for (; pWVar9 < pWVar10; pWVar9 = pWVar9 + 1) {
      if ((pWVar9->prereqAll & uVar5) != 0) {
        *(byte *)&pWVar9->wtFlags = (byte)pWVar9->wtFlags | 4;
      }
    }
    if (uVar12 != local_39) {
      memmove(pWInfo->a + (uVar12 - 1),pWInfo->a + uVar12,
              (long)((ulong)((uint)local_39 - (int)uVar12) * 0x7000000000) >> 0x20);
      local_39 = pWInfo->nLevel;
    }
    BVar8 = BVar8 & ~uVar5;
    local_39 = local_39 - 1;
    pWInfo->nLevel = local_39;
  } while( true );
}

Assistant:

static SQLITE_NOINLINE Bitmask whereOmitNoopJoin(
  WhereInfo *pWInfo,
  Bitmask notReady
){
  int i;
  Bitmask tabUsed;
  int hasRightJoin;

  /* Preconditions checked by the caller */
  assert( pWInfo->nLevel>=2 );
  assert( OptimizationEnabled(pWInfo->pParse->db, SQLITE_OmitNoopJoin) );

  /* These two preconditions checked by the caller combine to guarantee
  ** condition (1) of the header comment */
  assert( pWInfo->pResultSet!=0 );
  assert( 0==(pWInfo->wctrlFlags & WHERE_AGG_DISTINCT) );

  tabUsed = sqlite3WhereExprListUsage(&pWInfo->sMaskSet, pWInfo->pResultSet);
  if( pWInfo->pOrderBy ){
    tabUsed |= sqlite3WhereExprListUsage(&pWInfo->sMaskSet, pWInfo->pOrderBy);
  }
  hasRightJoin = (pWInfo->pTabList->a[0].fg.jointype & JT_LTORJ)!=0;
  for(i=pWInfo->nLevel-1; i>=1; i--){
    WhereTerm *pTerm, *pEnd;
    SrcItem *pItem;
    WhereLoop *pLoop;
    Bitmask m1;
    pLoop = pWInfo->a[i].pWLoop;
    pItem = &pWInfo->pTabList->a[pLoop->iTab];
    if( (pItem->fg.jointype & (JT_LEFT|JT_RIGHT))!=JT_LEFT ) continue;
    if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)==0
     && (pLoop->wsFlags & WHERE_ONEROW)==0
    ){
      continue;
    }
    if( (tabUsed & pLoop->maskSelf)!=0 ) continue;
    pEnd = pWInfo->sWC.a + pWInfo->sWC.nTerm;
    for(pTerm=pWInfo->sWC.a; pTerm<pEnd; pTerm++){
      if( (pTerm->prereqAll & pLoop->maskSelf)!=0 ){
        if( !ExprHasProperty(pTerm->pExpr, EP_OuterON)
         || pTerm->pExpr->w.iJoin!=pItem->iCursor
        ){
          break;
        }
      }
      if( hasRightJoin
       && ExprHasProperty(pTerm->pExpr, EP_InnerON)
       && NEVER(pTerm->pExpr->w.iJoin==pItem->iCursor)
      ){
        break;  /* restriction (5) */
      }
    }
    if( pTerm<pEnd ) continue;
    WHERETRACE(0xffffffff,("-> omit unused FROM-clause term %c\n",pLoop->cId));
    m1 = MASKBIT(i)-1;
    testcase( ((pWInfo->revMask>>1) & ~m1)!=0 );
    pWInfo->revMask = (m1 & pWInfo->revMask) | ((pWInfo->revMask>>1) & ~m1);
    notReady &= ~pLoop->maskSelf;
    for(pTerm=pWInfo->sWC.a; pTerm<pEnd; pTerm++){
      if( (pTerm->prereqAll & pLoop->maskSelf)!=0 ){
        pTerm->wtFlags |= TERM_CODED;
      }
    }
    if( i!=pWInfo->nLevel-1 ){
      int nByte = (pWInfo->nLevel-1-i) * sizeof(WhereLevel);
      memmove(&pWInfo->a[i], &pWInfo->a[i+1], nByte);
    }
    pWInfo->nLevel--;
    assert( pWInfo->nLevel>0 );
  }
  return notReady;
}